

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcerr.cpp
# Opt level: O0

char * tcerr_get_msg(int msgnum,int verbose)

{
  int in_ESI;
  int in_EDI;
  char *msg;
  char *local_8;
  
  local_8 = err_get_msg(tc_messages,tc_message_count,in_EDI,in_ESI);
  if ((local_8 == (char *)0x0) &&
     (local_8 = err_get_msg(vm_messages,vm_message_count,in_EDI,in_ESI), local_8 == (char *)0x0)) {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char *tcerr_get_msg(int msgnum, int verbose)
{
    const char *msg;
    
    /* look up the message in the compiler message array */
    msg = err_get_msg(tc_messages, tc_message_count,
                      msgnum, verbose);
    if (msg != 0)
        return msg;

    /* look up the message in the interpreter message array */
    msg = err_get_msg(vm_messages, vm_message_count,
                      msgnum, verbose);
    if (msg != 0)
        return msg;

    /* there's nowhere else to look - return failiure */
    return 0;
}